

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O2

void tcu::writeTxtCaselistsToFiles(TestPackageRoot *root,TestContext *testCtx,CommandLine *cmdLine)

{
  char cVar1;
  bool bVar2;
  State SVar3;
  TestNode *pTVar4;
  ostream *poVar5;
  string *psVar6;
  Exception *this;
  char *pcVar7;
  allocator<char> local_30b;
  allocator<char> local_30a;
  allocator<char> local_309;
  char *local_308;
  char *local_300;
  MovePtr<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_> caseListFilter;
  DefaultHierarchyInflater inflater;
  string local_2d8;
  string filename;
  string local_298;
  TestHierarchyIterator iter;
  ofstream out;
  int aiStack_210 [120];
  
  DefaultHierarchyInflater::DefaultHierarchyInflater(&inflater,testCtx);
  CommandLine::createCaseListFilter
            ((MovePtr<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&out,
             testCtx->m_cmdLine,testCtx->m_curArchive);
  caseListFilter.
  super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>.m_data
  .ptr = (CaseListFilter *)_out;
  _out = (pointer)0x0;
  de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
  ~UniqueBase((UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_> *)&out);
  TestHierarchyIterator::TestHierarchyIterator
            (&iter,root,&inflater.super_TestHierarchyInflater,
             caseListFilter.
             super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
             .m_data.ptr);
  local_308 = CommandLine::getCaseListExportFile(cmdLine);
  while( true ) {
    SVar3 = TestHierarchyIterator::getState(&iter);
    if (SVar3 == STATE_FINISHED) {
      TestHierarchyIterator::~TestHierarchyIterator(&iter);
      de::details::
      UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>::
      ~UniqueBase(&caseListFilter.
                   super_UniqueBase<const_tcu::CaseListFilter,_de::DefaultDeleter<const_tcu::CaseListFilter>_>
                 );
      DefaultHierarchyInflater::~DefaultHierarchyInflater(&inflater);
      return;
    }
    pTVar4 = TestHierarchyIterator::getNode(&iter);
    pcVar7 = (pTVar4->m_name)._M_dataplus._M_p;
    std::__cxx11::string::string<std::allocator<char>>((string *)&out,local_308,&local_309);
    local_300 = pcVar7;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,pcVar7,&local_30a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"txt",&local_30b);
    makePackageFilename(&filename,(string *)&out,&local_2d8,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&out);
    std::ofstream::ofstream((string *)&out,filename._M_dataplus._M_p,_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if ((cVar1 == '\0') || (*(int *)((long)aiStack_210 + *(long *)(_out + -0x18)) != 0)) break;
    print("Writing test cases from \'%s\' to file \'%s\'..\n",local_300,filename._M_dataplus._M_p);
    TestHierarchyIterator::next(&iter);
    while( true ) {
      pTVar4 = TestHierarchyIterator::getNode(&iter);
      if (pTVar4->m_nodeType == NODETYPE_PACKAGE) break;
      SVar3 = TestHierarchyIterator::getState(&iter);
      if (SVar3 == STATE_ENTER_NODE) {
        pTVar4 = TestHierarchyIterator::getNode(&iter);
        bVar2 = isTestNodeTypeExecutable(pTVar4->m_nodeType);
        pcVar7 = "TEST";
        if (!bVar2) {
          pcVar7 = "GROUP";
        }
        poVar5 = std::operator<<((ostream *)&out,pcVar7);
        poVar5 = std::operator<<(poVar5,": ");
        psVar6 = TestHierarchyIterator::getNodePath_abi_cxx11_(&iter);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::operator<<(poVar5,"\n");
      }
      TestHierarchyIterator::next(&iter);
    }
    TestHierarchyIterator::next(&iter);
    std::ofstream::~ofstream((string *)&out);
    std::__cxx11::string::~string((string *)&filename);
  }
  this = (Exception *)__cxa_allocate_exception(0x30,local_300);
  std::operator+(&local_2d8,"Failed to open ",&filename);
  Exception::Exception(this,&local_2d8);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void writeTxtCaselistsToFiles (TestPackageRoot& root, TestContext& testCtx, const CommandLine& cmdLine)
{
	DefaultHierarchyInflater			inflater		(testCtx);
	de::MovePtr<const CaseListFilter>	caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()));

	TestHierarchyIterator				iter			(root, inflater, *caseListFilter);
	const char* const					filenamePattern = cmdLine.getCaseListExportFile();

	while (iter.getState() != TestHierarchyIterator::STATE_FINISHED)
	{
		const TestNode* node		= iter.getNode();
		const char*		pkgName		= node->getName();
		const string	filename	= makePackageFilename(filenamePattern, pkgName, "txt");

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE &&
				  node->getNodeType() == NODETYPE_PACKAGE);

		std::ofstream out(filename.c_str(), std::ios_base::binary);
		if (!out.is_open() || !out.good())
			throw Exception("Failed to open " + filename);

		print("Writing test cases from '%s' to file '%s'..\n", pkgName, filename.c_str());

		iter.next();

		while (iter.getNode()->getNodeType() != NODETYPE_PACKAGE)
		{
			if (iter.getState() == TestHierarchyIterator::STATE_ENTER_NODE)
				out << (isTestNodeTypeExecutable(iter.getNode()->getNodeType()) ? "TEST" : "GROUP") << ": " << iter.getNodePath() << "\n";
			iter.next();
		}

		DE_ASSERT(iter.getState() == TestHierarchyIterator::STATE_LEAVE_NODE &&
				  iter.getNode()->getNodeType() == NODETYPE_PACKAGE);
		iter.next();
	}
}